

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  stbi__context *psVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  stbi_uc *psVar12;
  byte *pbVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  stbi_uc *__dest;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar22;
  byte bVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  byte *pbVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  byte *local_108;
  stbi_uc *local_e8;
  stbi_uc *local_c8;
  ulong local_88;
  ulong uVar21;
  
  uVar29 = (ulong)x;
  bVar32 = depth == 0x10;
  uVar7 = x * out_n;
  uVar8 = uVar7 << bVar32;
  psVar3 = a->s;
  iVar2 = psVar3->img_n;
  uVar9 = iVar2 << bVar32;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                  ,0xfb2,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar12 = (stbi_uc *)malloc((ulong)((out_n << bVar32) * y * x));
  a->out = psVar12;
  if (psVar12 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar10 = iVar2 * x;
  uVar20 = uVar10 * depth + 7 >> 3;
  uVar21 = (ulong)uVar20;
  uVar11 = (uVar20 + 1) * y;
  if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
    if (uVar11 == raw_len) {
LAB_00118f91:
      lVar14 = (long)iVar2;
      lVar18 = -(ulong)uVar8;
      lVar26 = (long)(out_n << bVar32);
      lVar24 = -lVar26;
      uVar11 = 0;
      uVar19 = 0;
      local_88 = uVar29;
      do {
        if (uVar19 == y) {
          if (7 < depth) {
            if (depth == 0x10) {
              psVar12 = a->out;
              for (lVar14 = 0; y * x * out_n != (int)lVar14; lVar14 = lVar14 + 1) {
                puVar1 = (ushort *)(psVar12 + lVar14 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            return 1;
          }
          uVar9 = 0;
          uVar19 = 0;
          do {
            if (uVar19 == y) {
              return 1;
            }
            bVar6 = 1;
            if (color == 0) {
              bVar6 = ""[depth];
            }
            uVar27 = (ulong)uVar9;
            psVar12 = a->out;
            uVar15 = (ulong)(uVar8 * (int)uVar19);
            if (depth == 4) {
              lVar14 = (uVar7 - uVar21) + uVar27;
              lVar18 = 0;
              for (uVar11 = uVar10; 1 < (int)uVar11; uVar11 = uVar11 - 2) {
                psVar12[lVar18 * 2 + uVar27] = (psVar12[lVar18 + lVar14] >> 4) * bVar6;
                psVar12[lVar18 * 2 + uVar27 + 1] = (psVar12[lVar18 + lVar14] & 0xf) * bVar6;
                lVar18 = lVar18 + 1;
              }
              if (uVar11 == 1) {
                psVar12[lVar18 * 2 + uVar27] = (psVar12[lVar18 + lVar14] >> 4) * bVar6;
              }
            }
            else {
              pbVar28 = psVar12 + ((uVar7 + uVar15) - uVar21);
              if (depth == 2) {
                psVar12 = psVar12 + uVar27 + 3;
                for (uVar11 = uVar10; 3 < (int)uVar11; uVar11 = uVar11 - 4) {
                  psVar12[-3] = (*pbVar28 >> 6) * bVar6;
                  psVar12[-2] = (*pbVar28 >> 4 & 3) * bVar6;
                  psVar12[-1] = (*pbVar28 >> 2 & 3) * bVar6;
                  *psVar12 = (*pbVar28 & 3) * bVar6;
                  pbVar28 = pbVar28 + 1;
                  psVar12 = psVar12 + 4;
                }
                if (((0 < (int)uVar11) && (psVar12[-3] = (*pbVar28 >> 6) * bVar6, uVar11 != 1)) &&
                   (psVar12[-2] = (*pbVar28 >> 4 & 3) * bVar6, uVar11 == 3)) {
                  psVar12[-1] = (*pbVar28 >> 2 & 3) * bVar6;
                }
              }
              else if (depth == 1) {
                pbVar13 = psVar12 + uVar27 + 7;
                for (uVar11 = uVar10; 7 < (int)uVar11; uVar11 = uVar11 - 8) {
                  pbVar13[-7] = (char)*pbVar28 >> 7 & bVar6;
                  pbVar13[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar6;
                  pbVar13[-5] = (char)(*pbVar28 << 2) >> 7 & bVar6;
                  pbVar13[-4] = (char)(*pbVar28 << 3) >> 7 & bVar6;
                  pbVar13[-3] = (char)(*pbVar28 << 4) >> 7 & bVar6;
                  pbVar13[-2] = (char)(*pbVar28 << 5) >> 7 & bVar6;
                  pbVar13[-1] = (char)(*pbVar28 << 6) >> 7 & bVar6;
                  bVar23 = bVar6;
                  if ((*pbVar28 & 1) == 0) {
                    bVar23 = 0;
                  }
                  *pbVar13 = bVar23;
                  pbVar28 = pbVar28 + 1;
                  pbVar13 = pbVar13 + 8;
                }
                if (((((0 < (int)uVar11) && (pbVar13[-7] = (char)*pbVar28 >> 7 & bVar6, uVar11 != 1)
                      ) && ((pbVar13[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar6, 2 < uVar11 &&
                            ((pbVar13[-5] = (char)(*pbVar28 << 2) >> 7 & bVar6, uVar11 != 3 &&
                             (pbVar13[-4] = (char)(*pbVar28 << 3) >> 7 & bVar6, 4 < uVar11)))))) &&
                    (pbVar13[-3] = (char)(*pbVar28 << 4) >> 7 & bVar6, uVar11 != 5)) &&
                   (pbVar13[-2] = (char)(*pbVar28 << 5) >> 7 & bVar6, uVar11 == 7)) {
                  pbVar13[-1] = (char)(*pbVar28 << 6) >> 7 & bVar6;
                }
              }
            }
            if (iVar2 != out_n) {
              psVar12 = a->out;
              if (iVar2 == 1) {
                uVar11 = x * 2 - 1;
                for (iVar25 = 0; -1 < (int)((x - 1) + iVar25); iVar25 = iVar25 + -1) {
                  psVar12[uVar11 + uVar15] = 0xff;
                  psVar12[(uVar11 - 1) + uVar15] = psVar12[((x - 1) + iVar25 & 0x7fffffff) + uVar15]
                  ;
                  uVar11 = uVar11 - 2;
                }
              }
              else {
                iVar25 = x - 1;
                uVar27 = uVar29 * 3;
                uVar11 = x * 4;
                if (iVar2 != 3) {
                  __assert_fail("img_n == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                                ,0x105d,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                while( true ) {
                  uVar27 = uVar27 - 3;
                  if (iVar25 < 0) break;
                  psVar12[(uVar11 - 1) + uVar15] = 0xff;
                  uVar31 = uVar27 & 0xffffffff;
                  psVar12[(uVar11 - 2) + uVar15] = psVar12[uVar31 + uVar15 + 2];
                  psVar12[(uVar11 - 3) + uVar15] = psVar12[uVar31 + uVar15 + 1];
                  psVar12[(uVar11 - 4) + uVar15] = psVar12[uVar31 + uVar15];
                  iVar25 = iVar25 + -1;
                  uVar11 = uVar11 - 4;
                }
              }
            }
            uVar19 = uVar19 + 1;
            uVar9 = uVar9 + uVar8;
          } while( true );
        }
        uVar15 = (ulong)*raw;
        if (4 < uVar15) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        psVar12 = a->out;
        local_c8 = psVar12 + uVar8 * (int)uVar19;
        local_e8 = local_c8;
        if (depth < 8) {
          if (x < uVar20) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                          ,0xfc7,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          local_e8 = local_c8 + (uVar7 - uVar20);
          uVar9 = 1;
          local_88 = uVar21;
        }
        if (uVar19 == 0) {
          uVar15 = (ulong)""[uVar15];
        }
        uVar27 = (ulong)uVar11;
        uVar31 = 0;
        if (0 < (int)uVar9) {
          uVar31 = (ulong)uVar9;
        }
        lVar22 = uVar27 + lVar18;
        for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
          switch(uVar15) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar6 = raw[uVar17 + 1];
            break;
          case 2:
            bVar6 = psVar12[uVar17 + lVar22];
            goto LAB_00119165;
          case 3:
            bVar6 = psVar12[uVar17 + lVar22] >> 1;
LAB_00119165:
            bVar6 = bVar6 + raw[uVar17 + 1];
            break;
          case 4:
            bVar6 = raw[uVar17 + 1];
            iVar25 = stbi__paeth(0,(uint)psVar12[uVar17 + lVar22],0);
            bVar6 = (char)iVar25 + bVar6;
            break;
          default:
            goto switchD_00119121_default;
          }
          local_e8[uVar17] = bVar6;
switchD_00119121_default:
        }
        lVar22 = (long)(int)uVar9;
        if (depth == 8) {
          lVar16 = (long)out_n;
          lVar4 = lVar14;
          if (iVar2 != out_n) {
            local_e8[lVar14] = 0xff;
          }
LAB_001191eb:
          local_108 = raw + lVar4 + 1;
        }
        else {
          if (depth == 0x10) {
            lVar16 = lVar26;
            lVar4 = lVar22;
            if (iVar2 != out_n) {
              local_e8[lVar22] = 0xff;
              local_e8[lVar22 + 1] = 0xff;
            }
            goto LAB_001191eb;
          }
          local_108 = raw + 2;
          lVar16 = 1;
        }
        __dest = local_e8 + lVar16;
        if (depth < 8 || iVar2 == out_n) {
          uVar30 = ((int)local_88 + -1) * uVar9;
          switch(uVar15) {
          case 0:
            memcpy(__dest,local_108,(long)(int)uVar30);
            break;
          case 1:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
              __dest[uVar15] = __dest[uVar15 - lVar22] + local_108[uVar15];
            }
            break;
          case 2:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
              __dest[uVar15] = psVar12[uVar15 + lVar16 + uVar27 + lVar18] + local_108[uVar15];
            }
            break;
          case 3:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
              __dest[uVar15] =
                   (char)((uint)__dest[uVar15 - lVar22] +
                          (uint)psVar12[uVar15 + lVar16 + uVar27 + lVar18] >> 1) + local_108[uVar15]
              ;
            }
            break;
          case 4:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            uVar15 = (ulong)uVar5;
            pbVar13 = psVar12 + lVar16 + uVar27 + lVar18;
            pbVar28 = local_108;
            while (bVar32 = uVar15 != 0, uVar15 = uVar15 - 1, bVar32) {
              bVar6 = *pbVar28;
              iVar25 = stbi__paeth((uint)__dest[-lVar22],(uint)*pbVar13,(uint)pbVar13[-lVar22]);
              *__dest = (char)iVar25 + bVar6;
              __dest = __dest + 1;
              pbVar13 = pbVar13 + 1;
              pbVar28 = pbVar28 + 1;
            }
            break;
          case 5:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
              __dest[uVar15] = (__dest[uVar15 - lVar22] >> 1) + local_108[uVar15];
            }
            break;
          case 6:
            uVar5 = uVar30;
            if ((int)uVar30 < 1) {
              uVar5 = 0;
            }
            for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
              __dest[uVar15] = __dest[uVar15 - lVar22] + local_108[uVar15];
            }
          }
          local_108 = local_108 + (int)uVar30;
        }
        else {
          if (iVar2 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                          ,0x1004,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          if ((byte)uVar15 < 7) {
            local_c8 = local_c8 + lVar16 + lVar18;
            switch(uVar15) {
            case 0:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] = local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
              }
              break;
            case 1:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] = __dest[uVar17 + lVar24] + local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
              }
              break;
            case 2:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] = local_c8[uVar17] + local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
                local_c8 = local_c8 + lVar26;
              }
              break;
            case 3:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] =
                       (char)((uint)__dest[uVar17 + lVar24] + (uint)local_c8[uVar17] >> 1) +
                       local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
                local_c8 = local_c8 + lVar26;
              }
              break;
            case 4:
              local_e8 = local_e8 + lVar16 + lVar24;
              psVar12 = psVar12 + lVar16 + uVar27 + (lVar24 - (ulong)uVar8);
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar30 != 0) {
                for (uVar15 = 0; uVar31 != uVar15; uVar15 = uVar15 + 1) {
                  bVar6 = local_108[uVar15];
                  iVar25 = stbi__paeth((uint)local_e8[uVar15],(uint)local_c8[uVar15],
                                       (uint)psVar12[uVar15]);
                  __dest[uVar15] = (char)iVar25 + bVar6;
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
                local_c8 = local_c8 + lVar26;
                local_e8 = local_e8 + lVar26;
                psVar12 = psVar12 + lVar26;
                uVar15 = (ulong)uVar30;
              }
              break;
            case 5:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] = (__dest[uVar17 + lVar24] >> 1) + local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
              }
              break;
            case 6:
              uVar15 = uVar29;
              while (uVar30 = (int)uVar15 - 1, uVar15 = (ulong)uVar30, uVar30 != 0) {
                for (uVar17 = 0; uVar31 != uVar17; uVar17 = uVar17 + 1) {
                  __dest[uVar17] = __dest[uVar17 + lVar24] + local_108[uVar17];
                }
                __dest[lVar22] = 0xff;
                local_108 = local_108 + lVar22;
                __dest = __dest + lVar26;
              }
            }
          }
          if (depth == 0x10) {
            psVar12 = a->out + (long)(int)(uVar9 + 1) + uVar27;
            uVar15 = uVar29;
            while (iVar25 = (int)uVar15, uVar15 = (ulong)(iVar25 - 1), iVar25 != 0) {
              *psVar12 = 0xff;
              psVar12 = psVar12 + lVar26;
            }
          }
        }
        uVar19 = uVar19 + 1;
        uVar11 = uVar8 + uVar11;
        raw = local_108;
      } while( true );
    }
  }
  else if (uVar11 <= raw_len) goto LAB_00118f91;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * output_bytes); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); break;
         }
         #undef CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            int q;
            // insert alpha = 255
            cur = a->out + stride*j;
            if (img_n == 1) {
               for (q=x-1; q >= 0; --q) {
                  cur[q*2+1] = 255;
                  cur[q*2+0] = cur[q];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (q=x-1; q >= 0; --q) {
                  cur[q*4+3] = 255;
                  cur[q*4+2] = cur[q*3+2];
                  cur[q*4+1] = cur[q*3+1];
                  cur[q*4+0] = cur[q*3+0];
               }
            }
         }
      }
   } else if (depth == 16) {
      // force the image data from big-endian to platform-native.
      // this is done in a separate pass due to the decoding relying
      // on the data being untouched, but could probably be done
      // per-line during decode if care is taken.
      stbi_uc *cur = a->out;
      stbi__uint16 *cur16 = (stbi__uint16*)cur;

      for(i=0; i < x*y*out_n; ++i,cur16++,cur+=2) {
         *cur16 = (cur[0] << 8) | cur[1];
      }
   }

   return 1;
}